

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> * __thiscall
duckdb::BoxRenderer::FetchRenderCollections_abi_cxx11_
          (list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           *__return_storage_ptr__,BoxRenderer *this,ClientContext *context,
          ColumnDataCollection *result,idx_t top_rows,idx_t bottom_rows)

{
  ColumnDataCollection *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  size_type sVar3;
  long lVar4;
  int iVar5;
  size_type __new_size;
  reference pvVar6;
  reference result_00;
  const_reference pvVar7;
  reference pvVar8;
  ulong uVar9;
  idx_t iVar10;
  bool bVar11;
  idx_t c;
  size_type sVar12;
  size_type sVar13;
  ulong uVar14;
  size_type __n;
  bool bVar15;
  idx_t local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  readable_numbers;
  idx_t local_1b0;
  vector<duckdb::LogicalType,_true> varchar_types;
  string numeric_val;
  DataChunk fetch_result;
  DataChunk insert_result;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Vector slice;
  
  __new_size = ((long)(result->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(result->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18;
  varchar_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  varchar_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  varchar_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar13 = __new_size;
  while (bVar15 = sVar13 != 0, sVar13 = sVar13 - 1, bVar15) {
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&varchar_types,
               &LogicalType::VARCHAR);
  }
  (__return_storage_ptr__->
  super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>).
  _M_impl._M_node._M_size = 0;
  ::std::__cxx11::list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>>::
  emplace_back<duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            ((list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> *)
             __return_storage_ptr__,context,&varchar_types);
  ::std::__cxx11::list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>>::
  emplace_back<duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            ((list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> *)
             __return_storage_ptr__,context,&varchar_types);
  p_Var1 = (__return_storage_ptr__->
           super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  p_Var2 = (__return_storage_ptr__->
           super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  DataChunk::DataChunk(&fetch_result);
  DataChunk::Initialize(&fetch_result,context,&result->types,0x800);
  DataChunk::DataChunk(&insert_result);
  DataChunk::Initialize(&insert_result,context,&varchar_types,0x800);
  if (((this->config).large_number_rendering == FOOTER) &&
     (((this->config).render_mode != ROWS || (result->count != 1)))) {
    (this->config).large_number_rendering = NONE;
  }
  this_00 = (ColumnDataCollection *)(p_Var1 + 1);
  local_1b0 = 0;
  uVar9 = 0;
  do {
    uVar14 = top_rows - uVar9;
    if (top_rows < uVar9 || uVar14 == 0) {
      local_208 = ColumnDataCollection::ChunkCount(result);
      for (uVar9 = 0; uVar14 = bottom_rows - uVar9, uVar9 <= bottom_rows && uVar14 != 0;
          uVar9 = uVar9 + lVar4) {
        DataChunk::Reset(&fetch_result);
        DataChunk::Reset(&insert_result);
        local_208 = local_208 - 1;
        ColumnDataCollection::FetchChunk(result,local_208,&fetch_result);
        if (CONCAT44(fetch_result.count._4_4_,(int)fetch_result.count) < uVar14) {
          uVar14 = CONCAT44(fetch_result.count._4_4_,(int)fetch_result.count);
        }
        SelectionVector::SelectionVector((SelectionVector *)&numeric_val,uVar14);
        iVar5 = (int)fetch_result.count;
        for (iVar10 = 0; iVar5 = iVar5 + -1, uVar14 != iVar10; iVar10 = iVar10 + 1) {
          *(int *)(numeric_val._M_dataplus._M_p + iVar10 * 4) = iVar5;
        }
        for (sVar12 = 0; __new_size != sVar12; sVar12 = sVar12 + 1) {
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&fetch_result.data,sVar12);
          Vector::Vector(&slice,pvVar6,(SelectionVector *)&numeric_val,uVar14);
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&insert_result.data,sVar12);
          VectorOperations::Cast(context,&slice,pvVar6,uVar14,false);
          Vector::~Vector(&slice);
        }
        insert_result.count = uVar14;
        ColumnDataCollection::Append((ColumnDataCollection *)(p_Var2 + 1),&insert_result);
        lVar4 = CONCAT44(fetch_result.count._4_4_,(int)fetch_result.count);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &numeric_val.field_2._M_allocated_capacity);
      }
      DataChunk::~DataChunk(&insert_result);
      DataChunk::~DataChunk(&fetch_result);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&varchar_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      return __return_storage_ptr__;
    }
    DataChunk::Reset(&fetch_result);
    DataChunk::Reset(&insert_result);
    ColumnDataCollection::FetchChunk(result,local_1b0,&fetch_result);
    if (CONCAT44(fetch_result.count._4_4_,(int)fetch_result.count) < uVar14) {
      uVar14 = CONCAT44(fetch_result.count._4_4_,(int)fetch_result.count);
    }
    for (sVar12 = 0; __new_size != sVar12; sVar12 = sVar12 + 1) {
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&fetch_result.data,sVar12);
      result_00 = vector<duckdb::Vector,_true>::get<true>(&insert_result.data,sVar12);
      VectorOperations::Cast(context,pvVar6,result_00,uVar14,false);
    }
    insert_result.count = uVar14;
    ColumnDataCollection::Append(this_00,&insert_result);
    if ((this->config).large_number_rendering == FOOTER) {
      readable_numbers.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      readable_numbers.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      readable_numbers.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&readable_numbers,__new_size);
      __n = 0;
      bVar15 = true;
      while (bVar11 = bVar15, __new_size != __n) {
        pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(&result->types,__n);
        bVar11 = false;
        if ((0x32 < (ulong)pvVar7->id_) ||
           ((0x60000f0e07800U >> ((ulong)pvVar7->id_ & 0x3f) & 1) == 0)) break;
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&insert_result.data,__n);
        Vector::GetValue((Value *)&slice,pvVar6,0);
        Value::ToString_abi_cxx11_(&numeric_val,(Value *)&slice);
        Value::~Value((Value *)&slice);
        TryFormatLargeNumber((string *)&slice,this,&numeric_val);
        pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&readable_numbers,__n);
        ::std::__cxx11::string::operator=((string *)pvVar8,(string *)&slice);
        ::std::__cxx11::string::~string((string *)&slice);
        pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&readable_numbers,__n);
        sVar3 = pvVar8->_M_string_length;
        if (sVar3 == 0) {
          bVar11 = false;
        }
        else {
          pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(&readable_numbers,__n);
          ::std::operator+(&local_b8,"(",pvVar8);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &slice,&local_b8,")");
          pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(&readable_numbers,__n);
          ::std::__cxx11::string::operator=((string *)pvVar8,(string *)&slice);
          ::std::__cxx11::string::~string((string *)&slice);
          ::std::__cxx11::string::~string((string *)&local_b8);
          bVar11 = bVar15;
        }
        ::std::__cxx11::string::~string((string *)&numeric_val);
        __n = __n + 1;
        bVar15 = bVar11;
        if (sVar3 == 0) break;
      }
      DataChunk::Reset(&insert_result);
      if (bVar11) {
        for (sVar12 = 0; __new_size != sVar12; sVar12 = sVar12 + 1) {
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&insert_result.data,sVar12);
          pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(&readable_numbers,sVar12);
          ::std::__cxx11::string::string((string *)&local_d8,(string *)pvVar8);
          Value::Value((Value *)&slice,&local_d8);
          Vector::SetValue(pvVar6,0,(Value *)&slice);
          Value::~Value((Value *)&slice);
          ::std::__cxx11::string::~string((string *)&local_d8);
        }
        insert_result.count = 1;
        ColumnDataCollection::Append(this_00,&insert_result);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&readable_numbers);
    }
    local_1b0 = local_1b0 + 1;
    uVar9 = uVar9 + CONCAT44(fetch_result.count._4_4_,(int)fetch_result.count);
  } while( true );
}

Assistant:

list<ColumnDataCollection> BoxRenderer::FetchRenderCollections(ClientContext &context,
                                                               const ColumnDataCollection &result, idx_t top_rows,
                                                               idx_t bottom_rows) {
	auto column_count = result.ColumnCount();
	vector<LogicalType> varchar_types;
	for (idx_t c = 0; c < column_count; c++) {
		varchar_types.emplace_back(LogicalType::VARCHAR);
	}
	std::list<ColumnDataCollection> collections;
	collections.emplace_back(context, varchar_types);
	collections.emplace_back(context, varchar_types);

	auto &top_collection = collections.front();
	auto &bottom_collection = collections.back();

	DataChunk fetch_result;
	fetch_result.Initialize(context, result.Types());

	DataChunk insert_result;
	insert_result.Initialize(context, varchar_types);

	if (config.large_number_rendering == LargeNumberRendering::FOOTER) {
		if (config.render_mode != RenderMode::ROWS || result.Count() != 1) {
			// large number footer can only be constructed (1) if we have a single row, and (2) in ROWS mode
			config.large_number_rendering = LargeNumberRendering::NONE;
		}
	}

	// fetch the top rows from the ColumnDataCollection
	idx_t chunk_idx = 0;
	idx_t row_idx = 0;
	while (row_idx < top_rows) {
		fetch_result.Reset();
		insert_result.Reset();
		// fetch the next chunk
		result.FetchChunk(chunk_idx, fetch_result);
		idx_t insert_count = MinValue<idx_t>(fetch_result.size(), top_rows - row_idx);

		// cast all columns to varchar
		for (idx_t c = 0; c < column_count; c++) {
			VectorOperations::Cast(context, fetch_result.data[c], insert_result.data[c], insert_count);
		}
		insert_result.SetCardinality(insert_count);

		// construct the render collection
		top_collection.Append(insert_result);

		// if we have are constructing a footer
		if (config.large_number_rendering == LargeNumberRendering::FOOTER) {
			D_ASSERT(insert_count == 1);
			vector<string> readable_numbers;
			readable_numbers.resize(column_count);
			bool all_readable = true;
			for (idx_t c = 0; c < column_count; c++) {
				if (!result.Types()[c].IsNumeric()) {
					// not a numeric type - cannot summarize
					all_readable = false;
					break;
				}
				// add a readable rendering of the value (i.e. "1234567" becomes "1.23 million")
				// we only add the rendering if the string is big
				auto numeric_val = insert_result.data[c].GetValue(0).ToString();
				readable_numbers[c] = TryFormatLargeNumber(numeric_val);
				if (readable_numbers[c].empty()) {
					all_readable = false;
					break;
				}
				readable_numbers[c] = "(" + readable_numbers[c] + ")";
			}
			insert_result.Reset();
			if (all_readable) {
				for (idx_t c = 0; c < column_count; c++) {
					insert_result.data[c].SetValue(0, Value(readable_numbers[c]));
				}
				insert_result.SetCardinality(1);
				top_collection.Append(insert_result);
			}
		}

		chunk_idx++;
		row_idx += fetch_result.size();
	}

	// fetch the bottom rows from the ColumnDataCollection
	row_idx = 0;
	chunk_idx = result.ChunkCount() - 1;
	while (row_idx < bottom_rows) {
		fetch_result.Reset();
		insert_result.Reset();
		// fetch the next chunk
		result.FetchChunk(chunk_idx, fetch_result);
		idx_t insert_count = MinValue<idx_t>(fetch_result.size(), bottom_rows - row_idx);

		// invert the rows
		SelectionVector inverted_sel(insert_count);
		for (idx_t r = 0; r < insert_count; r++) {
			inverted_sel.set_index(r, fetch_result.size() - r - 1);
		}

		for (idx_t c = 0; c < column_count; c++) {
			Vector slice(fetch_result.data[c], inverted_sel, insert_count);
			VectorOperations::Cast(context, slice, insert_result.data[c], insert_count);
		}
		insert_result.SetCardinality(insert_count);
		// construct the render collection
		bottom_collection.Append(insert_result);

		chunk_idx--;
		row_idx += fetch_result.size();
	}
	return collections;
}